

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_CreateRepeatedPtrField_Test::~ArenaTest_CreateRepeatedPtrField_Test
          (ArenaTest_CreateRepeatedPtrField_Test *this)

{
  ArenaTest_CreateRepeatedPtrField_Test *this_local;
  
  ~ArenaTest_CreateRepeatedPtrField_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, CreateRepeatedPtrField) {
  Arena arena;
  auto repeated = Arena::Create<RepeatedPtrField<TestAllTypes>>(&arena);
  TestUtil::SetAllFields(repeated->Add());

  TestUtil::ExpectAllFieldsSet(repeated->Get(0));
  EXPECT_EQ(repeated->GetArena(), &arena);
  EXPECT_EQ(repeated->Get(0).GetArena(), &arena);
  EXPECT_EQ(repeated->Get(0).optional_nested_message().GetArena(), &arena);
}